

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O2

PList * p_hash_table_keys(PHashTable *table)

{
  PList *list;
  uint uVar1;
  PHashTableNode *pPVar2;
  
  uVar1 = 0;
  if (table == (PHashTable *)0x0) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    for (; (ulong)uVar1 < table->size; uVar1 = uVar1 + 1) {
      pPVar2 = (PHashTableNode *)(table->table + uVar1);
      while (pPVar2 = pPVar2->next, pPVar2 != (PHashTableNode *)0x0) {
        list = p_list_append(list,pPVar2->key);
      }
    }
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_hash_table_keys (const PHashTable *table)
{
	PList		*ret = NULL;
	PHashTableNode	*node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; node = node->next)
			ret = p_list_append (ret, node->key);

	return ret;
}